

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O0

void __thiscall RuntimeVariableSymbol::~RuntimeVariableSymbol(RuntimeVariableSymbol *this)

{
  RuntimeVariableSymbol *in_RDI;
  
  ~RuntimeVariableSymbol(in_RDI);
  operator_delete(in_RDI,0x90);
  return;
}

Assistant:

RuntimeVariableSymbol(const std::string& name, const TypeName& type,
          std::shared_ptr<ExpressionNode> value, const Context& context):
    name_(name), type_(type), value_(std::move(value)), context_(context)
  {}